

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O2

string * AfterburnerUtil::trim(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  size_t ii;
  ulong uVar2;
  long lVar3;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < str->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar2];
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar3] = cVar1;
      lVar3 = lVar3 + 1;
    }
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string str) {
    // Convert all character in string to lower case
    std::string tmp = str;
    long number_of_char = 0;
    for (size_t ii = 0; ii < str.size(); ii++) {
        if (str[ii] != ' ' && str[ii] != '\t') {
            tmp[number_of_char] = str[ii];
            number_of_char++;
        }
    }
    tmp.resize(number_of_char);
    return tmp;
}